

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O0

void AddToBBox(float *child,float *parent)

{
  float *parent_local;
  float *child_local;
  
  if (*parent <= *child && *child != *parent) {
    *parent = *child;
  }
  if (child[1] < parent[1]) {
    parent[1] = child[1];
  }
  if (child[2] < parent[2]) {
    parent[2] = child[2];
  }
  if (parent[3] <= child[3] && child[3] != parent[3]) {
    parent[3] = child[3];
  }
  return;
}

Assistant:

static void AddToBBox(float child[4], float parent[4])
{
	if (child[BOXTOP] > parent[BOXTOP])
	{
		parent[BOXTOP] = child[BOXTOP];
	}
	if (child[BOXBOTTOM] < parent[BOXBOTTOM])
	{
		parent[BOXBOTTOM] = child[BOXBOTTOM];
	}
	if (child[BOXLEFT] < parent[BOXLEFT])
	{
		parent[BOXLEFT] = child[BOXLEFT];
	}
	if (child[BOXRIGHT] > parent[BOXRIGHT])
	{
		parent[BOXRIGHT] = child[BOXRIGHT];
	}
}